

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdSetScriptTreeFromString
              (void *handle,void *tree_handle,char *tree_string,char *tapscript,uint8_t leaf_version
              ,char *control_nodes)

{
  bool bVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  char in_R8B;
  char *in_R9;
  CfdException *except;
  exception *std_except;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> stack;
  ByteData256 node;
  size_t offset;
  size_t index;
  size_t max;
  size_t split_size;
  string control_str;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> target_nodes;
  Script tapscript_obj;
  TapBranch branch;
  value_type *tree;
  CfdCapiTapscriptTree *buffer;
  int result;
  size_type in_stack_fffffffffffffaa8;
  TaprootScriptTree *in_stack_fffffffffffffab0;
  ByteData *in_stack_fffffffffffffab8;
  string *in_stack_fffffffffffffac0;
  CfdError in_stack_fffffffffffffacc;
  CfdException *in_stack_fffffffffffffad0;
  allocator local_489;
  string local_488 [2];
  string *in_stack_fffffffffffffbb8;
  void *in_stack_fffffffffffffbc0;
  ByteData local_3d8;
  ByteData local_3c0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_3a8;
  string local_390;
  ByteData256 local_370;
  long local_358;
  ulong local_350;
  ulong local_348;
  ulong local_340;
  allocator local_331;
  string local_330;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_310;
  allocator local_2f1;
  string local_2f0;
  Script local_2d0;
  undefined1 local_292;
  allocator local_291;
  string local_290 [38];
  undefined1 local_26a;
  allocator local_269;
  string local_268 [32];
  CfdSourceLocation local_248;
  TaprootScriptTree local_230;
  allocator local_199;
  string local_198;
  TapBranch local_178;
  TapBranch local_100;
  reference local_88;
  long local_80;
  allocator local_71;
  string local_70 [52];
  undefined4 local_3c;
  char *local_38;
  char local_29;
  char *local_28;
  char *local_20;
  long local_18;
  
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_29 = in_R8B;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"TapscriptTree",&local_71);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  local_88 = std::
             vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::at
                       ((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                         *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    cfd::core::TapBranch::TapBranch(&local_100);
    bVar1 = cfd::capi::IsEmptyString(local_20);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,local_20,&local_199);
      cfd::core::TapBranch::FromString(&local_178,&local_198);
      cfd::core::TapBranch::operator=(&local_100,&local_178);
      cfd::core::TapBranch::~TapBranch(&in_stack_fffffffffffffab0->super_TapBranch);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
    }
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::clear
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)0x599600);
    std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
    emplace_back<cfd::core::TapBranch&>
              (*(vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> **)
                (local_80 + 0x18),&local_100);
    cfd::core::TaprootScriptTree::TaprootScriptTree(&local_230);
    cfd::core::TaprootScriptTree::operator=(local_88,&local_230);
    cfd::core::TaprootScriptTree::~TaprootScriptTree(in_stack_fffffffffffffab0);
    cfd::core::TapBranch::~TapBranch(&in_stack_fffffffffffffab0->super_TapBranch);
  }
  else {
    bVar1 = cfd::capi::IsEmptyString(local_20);
    if (bVar1) {
      local_248.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_script.cpp"
                   ,0x2f);
      local_248.filename = local_248.filename + 1;
      local_248.line = 0x236;
      local_248.funcname = "CfdSetScriptTreeFromString";
      cfd::core::logger::warn<>(&local_248,"tree_string is null or empty.");
      local_26a = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_268,"Failed to parameter. tree_string is null or empty.",&local_269);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
      local_26a = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (local_29 != -0x40) {
      local_292 = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_290,"Failed to parameter. leaf_version is not support.",&local_291);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
      local_292 = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,local_28,&local_2f1);
    cfd::core::Script::Script(&local_2d0,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector(&local_310)
    ;
    bVar1 = cfd::capi::IsEmptyString(local_38);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_330,local_38,&local_331);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      uVar3 = std::__cxx11::string::size();
      if ((uVar3 & 0x3f) == 0) {
        local_340 = 0x40;
        local_348 = std::__cxx11::string::size();
        local_348 = local_348 / local_340;
        for (local_350 = 0; local_350 < local_348; local_350 = local_350 + 1) {
          local_358 = local_350 * local_340;
          std::__cxx11::string::substr((ulong)&local_390,(ulong)&local_330);
          cfd::core::ByteData256::ByteData256(&local_370,&local_390);
          std::__cxx11::string::~string((string *)&local_390);
          std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
          emplace_back<cfd::core::ByteData256&>
                    ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                     &local_310,&local_370);
          cfd::core::ByteData256::~ByteData256((ByteData256 *)0x599aab);
        }
      }
      else {
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector(&local_3a8);
        cfd::core::Script::GetData(&local_3c0,&local_2d0);
        std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
        emplace_back<cfd::core::ByteData_const>
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
        cfd::core::ByteData::~ByteData((ByteData *)0x599bfe);
        cfd::core::ByteData::ByteData(&local_3d8,&local_330);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
        emplace_back<cfd::core::ByteData>(&local_3a8,&local_3d8);
        cfd::core::ByteData::~ByteData((ByteData *)0x599c39);
        in_stack_fffffffffffffab0 = (TaprootScriptTree *)0x0;
        cfd::core::TaprootUtil::ParseTaprootSignData
                  (&local_3a8,(SchnorrSignature *)0x0,(bool *)0x0,(uint8_t *)0x0,
                   (SchnorrPubkey *)0x0,&local_310,(Script *)0x0,
                   (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x0,
                   (ByteData *)0x0);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_fffffffffffffac0);
      }
      std::__cxx11::string::~string((string *)&local_330);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_488,local_20,&local_489);
    cfd::core::TaprootScriptTree::FromString
              ((TaprootScriptTree *)(local_488 + 1),local_488,&local_2d0,&local_310);
    cfd::core::TaprootScriptTree::operator=(local_88,(TaprootScriptTree *)(local_488 + 1));
    cfd::core::TaprootScriptTree::~TaprootScriptTree(in_stack_fffffffffffffab0);
    std::__cxx11::string::~string((string *)local_488);
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::clear
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)0x599dbf);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               in_stack_fffffffffffffac0);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffffab0);
  }
  return 0;
}

Assistant:

int CfdSetScriptTreeFromString(
    void* handle, void* tree_handle, const char* tree_string,
    const char* tapscript, uint8_t leaf_version, const char* control_nodes) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    auto& tree = buffer->tree_buffer->at(0);

    if (IsEmptyString(tapscript)) {
      TapBranch branch;
      if (!IsEmptyString(tree_string)) {
        branch = TapBranch::FromString(tree_string);
      }
      buffer->branch_buffer->clear();
      buffer->branch_buffer->emplace_back(branch);
      tree = TaprootScriptTree();
    } else if (IsEmptyString(tree_string)) {
      warn(CFD_LOG_SOURCE, "tree_string is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tree_string is null or empty.");
    } else {
      if (leaf_version != TaprootScriptTree::kTapScriptLeafVersion) {
        // TODO(k-matsuzawa): Support in the future.
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. leaf_version is not support.");
      }
      Script tapscript_obj(tapscript);
      std::vector<ByteData256> target_nodes;
      if (!IsEmptyString(control_nodes)) {
        std::string control_str(control_nodes);
        if ((control_str.size() % (cfd::core::kByteData256Length * 2)) == 0) {
          size_t split_size = cfd::core::kByteData256Length * 2;
          size_t max = control_str.size() / split_size;
          for (size_t index = 0; index < max; ++index) {
            size_t offset = index * split_size;
            ByteData256 node(control_str.substr(offset, split_size));
            target_nodes.emplace_back(node);
          }
        } else {  // control block
          std::vector<ByteData> stack;
          stack.emplace_back(tapscript_obj.GetData());
          stack.emplace_back(ByteData(control_str));
          TaprootUtil::ParseTaprootSignData(
              stack, nullptr, nullptr, nullptr, nullptr, &target_nodes,
              nullptr);
        }
      }

      tree = TaprootScriptTree::FromString(
          tree_string, tapscript_obj, target_nodes);
      buffer->branch_buffer->clear();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}